

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulatorimpllinux.cpp
# Opt level: O3

void __thiscall
XInputSimulatorImplLinux::keySequence(XInputSimulatorImplLinux *this,string *sequence)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  size_type sVar8;
  char local_42;
  char local_41;
  pointer local_40;
  size_type local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"key seq: ",9);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(sequence->_M_dataplus)._M_p,sequence->_M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_38 = sequence->_M_string_length;
  if (local_38 != 0) {
    local_40 = (sequence->_M_dataplus)._M_p;
    sVar8 = 0;
    do {
      cVar1 = local_40[sVar8];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cahr: ",6);
      local_42 = cVar1;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_42,1)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      uVar3 = (*(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl[0xc])
                        (this,(ulong)(uint)(int)cVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"key code: ",10);
      plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar3);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      iVar4 = isupper((int)cVar1);
      if (iVar4 == 0) {
        lVar7 = 0x58;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"upper ",6);
        local_41 = cVar1;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,&local_41,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        bVar2 = XKeysymToKeycode(this->display,0xffe1);
        (*(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl[9])(this,(ulong)bVar2);
        (*(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl[0xb])(this,(ulong)uVar3);
        bVar2 = XKeysymToKeycode(this->display,0xffe1);
        uVar3 = (uint)bVar2;
        lVar7 = 0x50;
      }
      (**(code **)((long)(this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl + lVar7))
                (this,uVar3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      sVar8 = sVar8 + 1;
    } while (local_38 != sVar8);
  }
  return;
}

Assistant:

void XInputSimulatorImplLinux::keySequence(const std::string &sequence)
{
    std::cout << "key seq: " << sequence << std::endl;

    for(const char c : sequence) {
        std::cout << "cahr: " << c << std::endl;
        int keyCode = this->charToKeyCode(c);
        std::cout << "key code: " << keyCode << std::endl;

        if (isupper(c)) {
            std::cout << "upper " << c << std::endl;

            this->keyDown(XKeysymToKeycode(display, XK_Shift_L));
            this->keyClick(keyCode);
            this->keyUp(XKeysymToKeycode(display, XK_Shift_L));
        }
        else {
            this->keyClick(keyCode);
        }


        std::cout << std::endl;
    }

}